

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O1

long bio_ctrl(BIO *bio,int cmd,long num,void *ptr)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)bio->ptr;
  if (plVar1 == (long *)0x0) {
    __assert_fail("b != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                  ,0x13d,"long bio_ctrl(BIO *, int, long, void *)");
  }
  lVar2 = 1;
  switch(cmd) {
  case 2:
    if (*plVar1 == 0) {
      return 1;
    }
    lVar2 = *(long *)(*plVar1 + 0x28);
    if (lVar2 == 0) {
      __assert_fail("peer_b != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0x182,"long bio_ctrl(BIO *, int, long, void *)");
    }
    if (*(long *)(lVar2 + 0x10) == 0) {
      return (ulong)(*(int *)(lVar2 + 8) != 0);
    }
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
    break;
  case 8:
    return (long)bio->shutdown;
  case 9:
    bio->shutdown = (int)num;
    return 1;
  case 10:
    if (*plVar1 != 0) {
      return *(long *)(*(long *)(*plVar1 + 0x28) + 0x10);
    }
    break;
  case 0xb:
    goto switchD_00469f9f_caseD_b;
  case 0xd:
    if (plVar1[5] != 0) {
      return plVar1[2];
    }
    break;
  default:
    switch(cmd) {
    case 0x89:
      lVar2 = plVar1[4];
      break;
    default:
      goto switchD_00469f9f_caseD_3;
    case 0x8c:
      if ((*plVar1 != 0) && ((int)plVar1[1] == 0)) {
        return plVar1[4] - plVar1[2];
      }
      goto switchD_00469f9f_caseD_3;
    case 0x8d:
      lVar2 = plVar1[6];
      break;
    case 0x8e:
      *(undefined4 *)(plVar1 + 1) = 1;
      break;
    case 0x93:
      plVar1[6] = 0;
    }
    goto switchD_00469f9f_caseD_b;
  }
switchD_00469f9f_caseD_3:
  lVar2 = 0;
switchD_00469f9f_caseD_b:
  return lVar2;
}

Assistant:

static long bio_ctrl(BIO *bio, int cmd, long num, void *ptr) {
  struct bio_bio_st *b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != nullptr);
  switch (cmd) {
    // Specific control codes first:
    case BIO_C_GET_WRITE_BUF_SIZE:
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows. Do we
      // need it? It implements |BIO_get_write_buf_size|, but we don't have the
      // wrapper.
      return static_cast<long>(b->size);

    case BIO_C_GET_WRITE_GUARANTEE:
      // How many bytes can the caller feed to the next write
      // without having to keep any?
      if (b->peer == nullptr || b->closed) {
        return 0;
      }
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
      return static_cast<long>(b->size - b->len);

    case BIO_C_GET_READ_REQUEST:
      // If the peer unsuccessfully tried to read, how many bytes
      // were requested?  (As with BIO_CTRL_PENDING, that number
      // can usually be treated as boolean.)
      //
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
      return static_cast<long>(b->request);

    case BIO_C_RESET_READ_REQUEST:
      // Reset request.  (Can be useful after read attempts
      // at the other side that are meant to be non-blocking,
      // e.g. when probing SSL_read to see if any data is
      // available.)
      b->request = 0;
      return 1;

    case BIO_C_SHUTDOWN_WR:
      // similar to shutdown(..., SHUT_WR)
      b->closed = 1;
      return 1;

    // Standard control codes:
    case BIO_CTRL_GET_CLOSE:
      return bio->shutdown;

    case BIO_CTRL_SET_CLOSE:
      bio->shutdown = static_cast<int>(num);
      return 1;

    case BIO_CTRL_PENDING:
      if (b->peer != nullptr) {
        struct bio_bio_st *peer_b =
            reinterpret_cast<bio_bio_st *>(b->peer->ptr);
        // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
        return static_cast<long>(peer_b->len);
      }
      return 0;

    case BIO_CTRL_WPENDING:
      if (b->buf == nullptr) {
        return 0;
      }
      // TODO(crbug.com/412584975): This can overflow on 64-bit Windows.
      return static_cast<long>(b->len);

    case BIO_CTRL_FLUSH:
      return 1;

    case BIO_CTRL_EOF: {
      if (b->peer) {
        auto *peer_b = reinterpret_cast<bio_bio_st *>(b->peer->ptr);
        assert(peer_b != nullptr);
        return peer_b->len == 0 && peer_b->closed;
      }
      return 1;
    }

    default:
      return 0;
  }
}